

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# args.cpp
# Opt level: O3

void dpfb::args::getValue(char ***cursor,char **optArgsEnd,int *var)

{
  undefined4 uVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  long lVar5;
  undefined8 extraout_RAX;
  args *this;
  ulong extraout_RDX;
  ulong uVar6;
  args *paVar7;
  char **ppcVar8;
  int iVar10;
  undefined1 auVar9 [16];
  undefined1 auVar11 [16];
  int iVar13;
  undefined1 auVar12 [16];
  char *end;
  args *paStack_68;
  int *piStack_60;
  args *local_20;
  
  advanceToArg(cursor,optArgsEnd);
  lVar5 = strtol(**cursor,(char **)&local_20,10);
  *var = (int)lVar5;
  ppcVar8 = *cursor;
  paVar7 = (args *)*ppcVar8;
  if (paVar7 != local_20) {
    return;
  }
  getValue();
  this = (args *)*ppcVar8;
  if (paVar7 <= this) {
    __assert_fail("cursor < optArgsEnd",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/danpla[P]dpfontbaker/src/args.cpp"
                  ,200,"void dpfb::args::advanceToArg(char **&, char **)");
  }
  *ppcVar8 = (char *)(this + 8);
  if (this + 8 != paVar7) {
    return;
  }
  advanceToArg(this);
  paStack_68 = (args *)CONCAT71((int7)((ulong)extraout_RAX >> 8),1);
  if (extraout_RDX != 0) {
    uVar6 = 0;
    piStack_60 = var;
    do {
      lVar5 = strtol((char *)this,(char **)&paStack_68,10);
      *(int *)(paVar7 + uVar6 * 4) = (int)lVar5;
      auVar4 = _DAT_0011e030;
      auVar3 = _DAT_0011e020;
      auVar2 = _DAT_0011e010;
      if (this == paStack_68) {
        return;
      }
      if (*paStack_68 == (args)0x0) {
        if (uVar6 == 0) {
          if (extraout_RDX == 1) {
            return;
          }
          uVar1 = *(undefined4 *)paVar7;
          lVar5 = extraout_RDX - 2;
          auVar9._8_4_ = (int)lVar5;
          auVar9._0_8_ = lVar5;
          auVar9._12_4_ = (int)((ulong)lVar5 >> 0x20);
          uVar6 = 0;
          auVar9 = auVar9 ^ _DAT_0011e030;
          do {
            auVar11._8_4_ = (int)uVar6;
            auVar11._0_8_ = uVar6;
            auVar11._12_4_ = (int)(uVar6 >> 0x20);
            auVar12 = (auVar11 | auVar3) ^ auVar4;
            iVar10 = auVar9._4_4_;
            if ((bool)(~(auVar12._4_4_ == iVar10 && auVar9._0_4_ < auVar12._0_4_ ||
                        iVar10 < auVar12._4_4_) & 1)) {
              *(undefined4 *)(paVar7 + uVar6 * 4 + 4) = uVar1;
            }
            if ((auVar12._12_4_ != auVar9._12_4_ || auVar12._8_4_ <= auVar9._8_4_) &&
                auVar12._12_4_ <= auVar9._12_4_) {
              *(undefined4 *)(paVar7 + uVar6 * 4 + 8) = uVar1;
            }
            auVar11 = (auVar11 | auVar2) ^ auVar4;
            iVar13 = auVar11._4_4_;
            if (iVar13 <= iVar10 && (iVar13 != iVar10 || auVar11._0_4_ <= auVar9._0_4_)) {
              *(undefined4 *)(paVar7 + uVar6 * 4 + 0xc) = uVar1;
              *(undefined4 *)(paVar7 + uVar6 * 4 + 0x10) = uVar1;
            }
            uVar6 = uVar6 + 4;
          } while ((extraout_RDX + 2 & 0xfffffffffffffffc) != uVar6);
          return;
        }
        if (uVar6 < extraout_RDX - 1) {
          return;
        }
      }
      else {
        if (*paStack_68 != (args)0x3a) {
          return;
        }
        if (extraout_RDX - 1 <= uVar6) {
          return;
        }
        this = paStack_68 + 1;
      }
      uVar6 = uVar6 + 1;
    } while (extraout_RDX != uVar6);
  }
  return;
}

Assistant:

static void getValue(char**& cursor, char** optArgsEnd, int& var)
{
    advanceToArg(cursor, optArgsEnd);

    char* end;
    var = std::strtol(*cursor, &end, 10);
    if (*cursor == end) {
        std::fprintf(stderr, "Invalid %s: %s\n", *(cursor - 1), *cursor);
        std::exit(EXIT_FAILURE);
    }
}